

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

bool __thiscall
ADSBExchangeConnection::ProcessErrors(ADSBExchangeConnection *this,JSON_Object *pObj)

{
  bool bVar1;
  logLevelTy lVar2;
  JSON_Object *object;
  ulong uVar3;
  undefined8 uVar4;
  long *in_RDI;
  string errTxt;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  JSON_Object *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  object = (JSON_Object *)jog_s(in_stack_ffffffffffffffa0,(char *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    in_stack_ffffffffffffff90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         jog_s(object,(char *)in_RDI);
    std::__cxx11::string::operator=
              ((string *)&stack0xffffffffffffffc8,(char *)in_stack_ffffffffffffff90);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (bVar1 = std::operator!=(in_stack_ffffffffffffff90,
                              (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
     , bVar1)) {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 4) {
      uVar4 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x1d7,"ProcessErrors",logERR,"ADS-B Exchange: Received an ERRor response: %s",uVar4);
    }
    (**(code **)(*in_RDI + 0x40))();
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return local_1;
}

Assistant:

bool ADSBExchangeConnection::ProcessErrors (const JSON_Object* pObj)
{
    // test for non-OK response in 'message' / 'msg'
    std::string errTxt = jog_s(pObj, ADSBEX_MESSAGE);
    if (errTxt.empty())
        errTxt = jog_s(pObj, ADSBEX_MSG);    
    if (!errTxt.empty() && errTxt != ADSBEX_SUCCESS)
    {
        LOG_MSG(logERR, ERR_ADSBEX_OTHER, errTxt.c_str());
        IncErrCnt();
        return false;
    }
    
    // Looks OK
    return true;
}